

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O0

JavascriptFunction * __thiscall
Js::JavascriptProxy::GetMethodHelper
          (JavascriptProxy *this,PropertyId methodId,ScriptContext *requestContext)

{
  bool bVar1;
  BOOL BVar2;
  RecyclableObject **ppRVar3;
  PropertyRecord *pPVar4;
  char16 *pcVar5;
  JavascriptFunction *pJVar6;
  ScriptContext *objectScriptContext;
  Var pvVar7;
  JavascriptFunction *function;
  Var pvStack_30;
  BOOL result;
  Var varMethod;
  ScriptContext *requestContext_local;
  JavascriptProxy *pJStack_18;
  PropertyId methodId_local;
  JavascriptProxy *this_local;
  
  varMethod = requestContext;
  requestContext_local._4_4_ = methodId;
  pJStack_18 = this;
  bVar1 = IsRevoked(this);
  pvVar7 = varMethod;
  if (bVar1) {
    pPVar4 = ScriptContext::GetPropertyName((ScriptContext *)varMethod,requestContext_local._4_4_);
    pcVar5 = PropertyRecord::GetBuffer(pPVar4);
    JavascriptError::ThrowTypeError((ScriptContext *)pvVar7,-0x7ff5ea15,pcVar5);
  }
  ppRVar3 = Memory::WriteBarrierPtr::operator_cast_to_RecyclableObject__
                      ((WriteBarrierPtr *)&this->handler);
  BVar2 = Js::JavascriptOperators::GetPropertyReference
                    (*ppRVar3,requestContext_local._4_4_,&stack0xffffffffffffffd0,
                     (ScriptContext *)varMethod,(PropertyValueInfo *)0x0);
  if ((BVar2 != 0) && (BVar2 = Js::JavascriptOperators::IsUndefinedOrNull(pvStack_30), BVar2 == 0))
  {
    bVar1 = VarIs<Js::JavascriptFunction>(pvStack_30);
    pvVar7 = varMethod;
    if (bVar1) {
      pJVar6 = VarTo<Js::JavascriptFunction>(pvStack_30);
      pvVar7 = varMethod;
      objectScriptContext = RecyclableObject::GetScriptContext((RecyclableObject *)pJVar6);
      pvVar7 = CrossSite::MarshalVar((ScriptContext *)pvVar7,pJVar6,objectScriptContext);
      pJVar6 = VarTo<Js::JavascriptFunction>(pvVar7);
      return pJVar6;
    }
    pPVar4 = ScriptContext::GetPropertyName((ScriptContext *)varMethod,requestContext_local._4_4_);
    pcVar5 = PropertyRecord::GetBuffer(pPVar4);
    JavascriptError::ThrowTypeError((ScriptContext *)pvVar7,-0x7ff5ec76,pcVar5);
  }
  return (JavascriptFunction *)0x0;
}

Assistant:

JavascriptFunction* JavascriptProxy::GetMethodHelper(PropertyId methodId, ScriptContext* requestContext)
    {
        //2. Let handler be the value of the[[ProxyHandler]] internal slot of O.
        //3. If handler is null, then throw a TypeError exception.
        if (IsRevoked())
        {
            // the proxy has been revoked; TypeError.
            JavascriptError::ThrowTypeError(requestContext, JSERR_ErrorOnRevokedProxy, requestContext->GetPropertyName(methodId)->GetBuffer());
        }
        Var varMethod;
        //5. Let trap be the result of GetMethod(handler, "getOwnPropertyDescriptor").
        //6. ReturnIfAbrupt(trap).

        //7.3.9 GetMethod(V, P)
        //  The abstract operation GetMethod is used to get the value of a specific property of an ECMAScript language value when the value of the
        //  property is expected to be a function. The operation is called with arguments V and P where V is the ECMAScript language value, P is the
        //  property key. This abstract operation performs the following steps:
        //  1. Assert: IsPropertyKey(P) is true.
        //  2. Let func be ? GetV(V, P).
        //  3. If func is either undefined or null, return undefined.
        //  4. If IsCallable(func) is false, throw a TypeError exception.
        //  5. Return func.
        BOOL result = JavascriptOperators::GetPropertyReference(handler, methodId, &varMethod, requestContext);
        if (!result || JavascriptOperators::IsUndefinedOrNull(varMethod))
        {
            return nullptr;
        }
        if (!VarIs<JavascriptFunction>(varMethod))
        {
            JavascriptError::ThrowTypeError(requestContext, JSERR_NeedFunction, requestContext->GetPropertyName(methodId)->GetBuffer());
        }

        JavascriptFunction* function = VarTo<JavascriptFunction>(varMethod);

        return VarTo<JavascriptFunction>(CrossSite::MarshalVar(requestContext,
          function, function->GetScriptContext()));
    }